

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int ReadInt64(unqlite_file *pFd,sxu64 *pOut,sxi64 iOfft)

{
  int iVar1;
  uchar zBuf [8];
  
  iVar1 = (*pFd->pMethods->xRead)(pFd,zBuf,8,iOfft);
  if (iVar1 == 0) {
    SyBigEndianUnpack64(zBuf,pOut);
  }
  return iVar1;
}

Assistant:

static int ReadInt64(unqlite_file *pFd,sxu64 *pOut,sxi64 iOfft)
{
	unsigned char zBuf[8];
	int rc;
	rc = unqliteOsRead(pFd,zBuf,sizeof(zBuf),iOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	SyBigEndianUnpack64(zBuf,pOut);
	return UNQLITE_OK;
}